

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  uint8_t uVar2;
  char cVar3;
  FILE *pFVar4;
  _Bool _Var5;
  _Bool listing;
  bool bVar6;
  int iVar7;
  bc_trie_t *trie;
  char *pcVar8;
  bc_slist_t *l;
  size_t len;
  char **strv;
  size_t sVar9;
  long lVar10;
  bc_slist_t *pbVar11;
  bc_slist_t *sources;
  bc_trie_t *pbVar12;
  bc_slist_t *ast;
  char *__path;
  FILE *__stream;
  int *piVar13;
  char *pcVar14;
  ulong uVar15;
  uint8_t *str;
  ulong uVar16;
  _bc_slist_t *p_Var17;
  ulong uVar18;
  size_t sStack_90;
  char *local_80;
  char *local_68;
  bc_slist_t *local_60;
  char *local_50;
  bc_error_t *err;
  ulong local_40;
  size_t input_len;
  
  setlocale(6,"");
  trie = bc_trie_new(free);
  pcVar8 = bc_strdup("0.20.1.29-b1ae");
  bc_trie_insert(trie,"BLOGC_VERSION",pcVar8);
  uVar18 = (ulong)argc;
  l = (bc_slist_t *)0x0;
  local_60 = (bc_slist_t *)0x0;
  local_68 = (char *)0x0;
  local_50 = (char *)0x0;
  local_80 = (char *)0x0;
  listing = false;
  bVar6 = false;
  local_40 = 0;
  for (uVar15 = 1; uVar15 < uVar18; uVar15 = uVar15 + 1) {
    pcVar8 = argv[uVar15];
    if (*pcVar8 != '-') {
      pcVar8 = bc_strdup(pcVar8);
      l = bc_slist_append(l,pcVar8);
      goto LAB_0010266d;
    }
    bVar1 = pcVar8[1];
    switch((uint)bVar1) {
    case 100:
      local_40 = CONCAT71((int7)((ulong)((long)&switchD_00102438::switchdataD_0010a004 +
                                        (long)(int)(&switchD_00102438::switchdataD_0010a004)
                                                   [bVar1 - 100]) >> 8),1);
      break;
    case 0x65:
      if (pcVar8[2] == '\0') {
        if (uVar15 + 1 < uVar18) {
          pcVar8 = bc_strdup(argv[uVar15 + 1]);
          local_60 = bc_slist_append(local_60,pcVar8);
          uVar15 = uVar15 + 1;
        }
      }
      else {
        pcVar8 = bc_strdup(pcVar8 + 2);
        local_60 = bc_slist_append(local_60,pcVar8);
      }
      break;
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x75:
switchD_00102438_caseD_66:
      blogc_print_usage();
      fprintf(_stderr,"blogc: error: invalid argument: -%c\n",(ulong)(uint)(int)argv[uVar15][1]);
LAB_00102978:
      pbVar11 = (bc_slist_t *)0x0;
      iVar7 = 1;
      goto LAB_00102a16;
    case 0x68:
      pcVar8 = 
      "usage:\n    blogc [-h] [-v] [-d] [-i] [-l [-e SOURCE]] [-D KEY=VALUE ...] [-p KEY]\n          [-t TEMPLATE] [-o OUTPUT] [SOURCE ...] - A blog compiler.\n\npositional arguments:\n    SOURCE        source file(s)\n\noptional arguments:\n    -h            show this help message and exit\n    -v            show version and exit\n    -d            enable debug\n    -i            read list of source files from standard input\n    -l            build listing page, from multiple source files\n    -e SOURCE     source file with content for listing page. requires \'-l\'\n    -D KEY=VALUE  set global variable\n    -p KEY        show the value of a variable after source parsing and exit\n    -t TEMPLATE   template file\n    -o OUTPUT     output file"
      ;
      goto LAB_0010282f;
    case 0x69:
      bVar6 = true;
      break;
    case 0x6c:
      listing = true;
      break;
    case 0x6f:
      if (pcVar8[2] == '\0') {
        if (uVar15 + 1 < uVar18) {
          local_50 = bc_strdup(argv[uVar15 + 1]);
          uVar15 = uVar15 + 1;
        }
      }
      else {
        local_50 = bc_strdup(pcVar8 + 2);
      }
      break;
    case 0x70:
      if (pcVar8[2] == '\0') {
        if (uVar15 + 1 < uVar18) {
          local_68 = bc_strdup(argv[uVar15 + 1]);
          uVar15 = uVar15 + 1;
        }
      }
      else {
        local_68 = bc_strdup(pcVar8 + 2);
      }
      break;
    case 0x74:
      if (pcVar8[2] == '\0') {
        if (uVar15 + 1 < uVar18) {
          local_80 = bc_strdup(argv[uVar15 + 1]);
          uVar15 = uVar15 + 1;
        }
      }
      else {
        local_80 = bc_strdup(pcVar8 + 2);
      }
      break;
    case 0x76:
      pcVar8 = "blogc 0.20.1.29-b1ae";
LAB_0010282f:
      puts(pcVar8);
LAB_00102837:
      pbVar11 = (bc_slist_t *)0x0;
      iVar7 = 0;
      goto LAB_00102a16;
    default:
      if (bVar1 != 0x44) goto switchD_00102438_caseD_66;
      if (pcVar8[2] == '\0') {
        uVar16 = uVar15 + 1;
        if ((uVar18 <= uVar16) ||
           (str = (uint8_t *)argv[uVar15 + 1], uVar15 = uVar16, str == (uint8_t *)0x0)) break;
      }
      else {
        str = (uint8_t *)(pcVar8 + 2);
        uVar16 = uVar15;
      }
      len = strlen((char *)str);
      _Var5 = bc_utf8_validate(str,len);
      if (_Var5) {
        strv = bc_str_split((char *)str,'=',2);
        sVar9 = bc_strv_length(strv);
        if (sVar9 == 2) {
          str = (uint8_t *)*strv;
          for (lVar10 = 0; uVar2 = str[lVar10], uVar2 != '\0'; lVar10 = lVar10 + 1) {
            if (lVar10 == 0) {
              if (0x19 < (byte)(uVar2 + 0xbf)) {
                pcVar8 = 
                "blogc: error: invalid value for -D (first character in configuration key must be uppercase): %s\n"
                ;
                goto LAB_00102963;
              }
            }
            else if ((0x19 < (byte)(uVar2 + 0xbf)) && (uVar2 != '_' && 9 < (byte)(uVar2 - 0x30))) {
              pcVar8 = 
              "blogc: error: invalid value for -D (configuration key must be uppercase with \'_\' and digits after first character): %s\n"
              ;
              goto LAB_00102963;
            }
          }
          pcVar8 = bc_strdup(strv[1]);
          bc_trie_insert(trie,(char *)str,pcVar8);
          bc_strv_free(strv);
          uVar15 = uVar16;
          break;
        }
        pcVar8 = "blogc: error: invalid value for -D (must have an \'=\'): %s\n";
LAB_00102963:
        fprintf(_stderr,pcVar8,str);
        bc_strv_free(strv);
        goto LAB_00102978;
      }
      fprintf(_stderr,"blogc: error: invalid value for -D (must be valid UTF-8 string): %s\n",str);
      goto LAB_00102837;
    }
LAB_0010266d:
  }
  if (bVar6) {
    pcVar8 = bc_stdin_read(&input_len);
    pbVar11 = blogc_filelist_parse(pcVar8,input_len);
    free(pcVar8);
    l = bc_slist_append_list(l,pbVar11);
  }
  if (!listing) {
    sVar9 = bc_slist_length(l);
    if (sVar9 == 0) {
      blogc_print_usage();
      pcVar8 = "blogc: error: one source file is required\n";
      sStack_90 = 0x2a;
    }
    else {
      sVar9 = bc_slist_length(l);
      if (sVar9 < 2) goto LAB_001026e3;
      blogc_print_usage();
      pcVar8 = "blogc: error: only one source file should be provided, if running without \'-l\'\n";
      sStack_90 = 0x4f;
    }
    fwrite(pcVar8,sStack_90,1,_stderr);
    iVar7 = 1;
    pbVar11 = (bc_slist_t *)0x0;
    goto LAB_00102a16;
  }
LAB_001026e3:
  err = (bc_error_t *)0x0;
  sources = blogc_source_parse_from_files(trie,l,&err);
  if (err == (bc_error_t *)0x0) {
    pbVar11 = (bc_slist_t *)0x0;
    if (listing) {
      for (p_Var17 = local_60; p_Var17 != (bc_slist_t *)0x0; p_Var17 = p_Var17->next) {
        if (*p_Var17->data == '\0') {
          pbVar12 = (bc_trie_t *)0x0;
        }
        else {
          pbVar12 = blogc_source_parse_from_file(trie,(char *)p_Var17->data,&err);
          if (err != (bc_error_t *)0x0) {
            bc_error_print(err,"blogc");
            goto LAB_00102816;
          }
        }
        pbVar11 = bc_slist_append(pbVar11,pbVar12);
      }
    }
    if (local_68 == (char *)0x0) {
      if (local_80 != (char *)0x0) {
        ast = blogc_template_parse_from_file(local_80,&err);
        if (err == (bc_error_t *)0x0) {
          if ((local_40 & 1) != 0) {
            blogc_debug_template(ast);
          }
          pcVar8 = blogc_render(ast,sources,pbVar11,trie,listing);
          if ((local_50 != (char *)0x0) && ((*local_50 != '-' || (local_50[1] != '\0')))) {
            __path = bc_strdup(local_50);
            pcVar14 = __path;
            do {
              cVar3 = *pcVar14;
              if ((cVar3 == '/') || (cVar3 == '\\')) {
                *pcVar14 = '\0';
                if ((*__path != '\0') && (iVar7 = mkdir(__path,0x1ff), iVar7 == -1)) {
                  piVar13 = __errno_location();
                  pFVar4 = _stderr;
                  if (*piVar13 != 0x11) {
                    pcVar8 = strerror(*piVar13);
                    fprintf(pFVar4,"blogc: error: failed to create output directory (%s): %s\n",
                            __path,pcVar8);
                    free(__path);
                    exit(2);
                  }
                }
                *pcVar14 = cVar3;
              }
              else if (cVar3 == '\0') goto LAB_00102981;
              pcVar14 = pcVar14 + 1;
            } while( true );
          }
          bVar6 = true;
          __stream = _stdout;
          goto LAB_001029bd;
        }
        bc_error_print(err,"blogc");
        iVar7 = 1;
        goto LAB_001029f0;
      }
      blogc_print_usage();
      fwrite("blogc: error: argument -t is required when rendering content\n",0x3d,1,_stderr);
LAB_00102816:
      iVar7 = 1;
    }
    else {
      if (listing || sources == (bc_slist_t *)0x0) {
        pbVar12 = (bc_trie_t *)0x0;
      }
      else {
        pbVar12 = (bc_trie_t *)sources->data;
      }
      iVar7 = 0;
      pcVar8 = blogc_format_variable(local_68,trie,pbVar12,(char *)0x0,(bc_slist_t *)0x0);
      if (pcVar8 == (char *)0x0) {
        fprintf(_stderr,"blogc: error: variable not found: %s\n",local_68);
        iVar7 = 0x4e;
      }
      else {
        puts(pcVar8);
      }
      free(pcVar8);
    }
  }
  else {
    bc_error_print(err,"blogc");
    iVar7 = 1;
    pbVar11 = (bc_slist_t *)0x0;
  }
LAB_001029f8:
  bc_slist_free_full(sources,bc_trie_free);
  bc_error_free(err);
LAB_00102a16:
  bc_trie_free(trie);
  free(local_80);
  free(local_50);
  free(local_68);
  bc_slist_free_full(local_60,free);
  bc_slist_free_full(pbVar11,bc_trie_free);
  bc_slist_free_full(l,free);
  return iVar7;
LAB_00102981:
  free(__path);
  __stream = fopen(local_50,"w");
  pFVar4 = _stderr;
  if (__stream == (FILE *)0x0) {
    piVar13 = __errno_location();
    pcVar14 = strerror(*piVar13);
    fprintf(pFVar4,"blogc: error: failed to open output file (%s): %s\n",local_50,pcVar14);
    iVar7 = 1;
  }
  else {
    bVar6 = false;
LAB_001029bd:
    if (pcVar8 != (char *)0x0) {
      fputs(pcVar8,__stream);
    }
    iVar7 = 0;
    if (!bVar6) {
      fclose(__stream);
    }
  }
  free(pcVar8);
LAB_001029f0:
  blogc_template_free_ast(ast);
  goto LAB_001029f8;
}

Assistant:

int
main(int argc, char **argv)
{
    setlocale(LC_ALL, "");

    int rv = 0;

#ifdef MAKE_EMBEDDED
    bool embedded = false;
#endif
    bool debug = false;
    bool input_stdin = false;
    bool listing = false;
    char *template = NULL;
    char *output = NULL;
    char *print = NULL;
    char *tmp = NULL;
    char **pieces = NULL;

    bc_slist_t *sources = NULL;
    bc_slist_t *listing_entries = NULL;
    bc_slist_t *listing_entries_source = NULL;
    bc_trie_t *config = bc_trie_new(free);
    bc_trie_insert(config, "BLOGC_VERSION", bc_strdup(PACKAGE_VERSION));

    for (size_t i = 1; i < argc; i++) {
        tmp = NULL;
        if (argv[i][0] == '-') {
            switch (argv[i][1]) {
                case 'h':
                    blogc_print_help();
                    goto cleanup;
                case 'v':
                    printf("blogc " PACKAGE_VERSION "\n");
                    goto cleanup;
                case 'd':
                    debug = true;
                    break;
                case 'i':
                    input_stdin = true;
                    break;
                case 'l':
                    listing = true;
                    break;
                case 'e':
                    if (argv[i][2] != '\0')
                        listing_entries = bc_slist_append(listing_entries, bc_strdup(argv[i] + 2));
                    else if (i + 1 < argc)
                        listing_entries = bc_slist_append(listing_entries, bc_strdup(argv[++i]));
                    break;
                case 't':
                    if (argv[i][2] != '\0')
                        template = bc_strdup(argv[i] + 2);
                    else if (i + 1 < argc)
                        template = bc_strdup(argv[++i]);
                    break;
                case 'o':
                    if (argv[i][2] != '\0')
                        output = bc_strdup(argv[i] + 2);
                    else if (i + 1 < argc)
                        output = bc_strdup(argv[++i]);
                    break;
                case 'p':
                    if (argv[i][2] != '\0')
                        print = bc_strdup(argv[i] + 2);
                    else if (i + 1 < argc)
                        print = bc_strdup(argv[++i]);
                    break;
                case 'D':
                    if (argv[i][2] != '\0')
                        tmp = argv[i] + 2;
                    else if (i + 1 < argc)
                        tmp = argv[++i];
                    if (tmp != NULL) {
                        if (!bc_utf8_validate((uint8_t*) tmp, strlen(tmp))) {
                            fprintf(stderr, "blogc: error: invalid value for "
                                "-D (must be valid UTF-8 string): %s\n", tmp);
                            goto cleanup;
                        }
                        pieces = bc_str_split(tmp, '=', 2);
                        if (bc_strv_length(pieces) != 2) {
                            fprintf(stderr, "blogc: error: invalid value for "
                                "-D (must have an '='): %s\n", tmp);
                            bc_strv_free(pieces);
                            rv = 1;
                            goto cleanup;
                        }
                        for (size_t j = 0; pieces[0][j] != '\0'; j++) {
                            char c = pieces[0][j];
                            if (j == 0) {
                                if (!(c >= 'A' && c <= 'Z')) {
                                    fprintf(stderr, "blogc: error: invalid value "
                                        "for -D (first character in configuration "
                                        "key must be uppercase): %s\n", pieces[0]);
                                    bc_strv_free(pieces);
                                    rv = 1;
                                    goto cleanup;
                                }
                                continue;
                            }
                            if (!((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')) {
                                fprintf(stderr, "blogc: error: invalid value "
                                    "for -D (configuration key must be uppercase "
                                    "with '_' and digits after first character): %s\n",
                                    pieces[0]);
                                bc_strv_free(pieces);
                                rv = 1;
                                goto cleanup;
                            }
                        }
                        bc_trie_insert(config, pieces[0], bc_strdup(pieces[1]));
                        bc_strv_free(pieces);
                        pieces = NULL;
                    }
                    break;
#ifdef MAKE_EMBEDDED
                case 'm':
                    embedded = true;
                    break;
#endif
                default:
                    blogc_print_usage();
                    fprintf(stderr, "blogc: error: invalid argument: -%c\n",
                        argv[i][1]);
                    rv = 1;
                    goto cleanup;
            }
        }
        else {
            sources = bc_slist_append(sources, bc_strdup(argv[i]));
        }

#ifdef MAKE_EMBEDDED
        if (embedded) {
            rv = bm_main(argc, argv);
            goto cleanup;
        }
#endif

    }

    if (input_stdin) {
        size_t input_len;
        char *input = bc_stdin_read(&input_len);
        bc_slist_t *input_list = blogc_filelist_parse(input, input_len);
        free(input);
        sources = bc_slist_append_list(sources, input_list);
    }

    if (!listing && bc_slist_length(sources) == 0) {
        blogc_print_usage();
        fprintf(stderr, "blogc: error: one source file is required\n");
        rv = 1;
        goto cleanup;
    }

    if (!listing && bc_slist_length(sources) > 1) {
        blogc_print_usage();
        fprintf(stderr, "blogc: error: only one source file should be provided, "
            "if running without '-l'\n");
        rv = 1;
        goto cleanup;
    }

    bc_error_t *err = NULL;

    bc_slist_t *s = blogc_source_parse_from_files(config, sources, &err);
    if (err != NULL) {
        bc_error_print(err, "blogc");
        rv = 1;
        goto cleanup2;
    }

    if (listing) {
        for (bc_slist_t *tmp = listing_entries; tmp != NULL; tmp = tmp->next) {
            if (0 == strlen(tmp->data)) {
                listing_entries_source = bc_slist_append(listing_entries_source, NULL);
                continue;
            }
            bc_trie_t *e = blogc_source_parse_from_file(config, tmp->data, &err);
            if (err != NULL) {
                bc_error_print(err, "blogc");
                rv = 1;
                goto cleanup2;
            }
            listing_entries_source = bc_slist_append(listing_entries_source, e);
        }
    }

    if (print != NULL) {
        bc_trie_t *local = NULL;
        if (!listing && s != NULL) {
            local = s->data;
        }
        char *val = blogc_format_variable(print, config, local, NULL, NULL);
        if (val == NULL) {
            fprintf(stderr, "blogc: error: variable not found: %s\n",
                print);
            rv = EX_CONFIG;
        }
        else {
            printf("%s\n", val);
        }
        free(val);
        goto cleanup2;
    }

    if (template == NULL) {
        blogc_print_usage();
        fprintf(stderr, "blogc: error: argument -t is required when rendering content\n");
        rv = 1;
        goto cleanup2;
    }

    bc_slist_t* l = blogc_template_parse_from_file(template, &err);
    if (err != NULL) {
        bc_error_print(err, "blogc");
        rv = 1;
        goto cleanup3;
    }

    if (debug)
        blogc_debug_template(l);

    char *out = blogc_render(l, s, listing_entries_source, config, listing);

    bool write_to_stdout = (output == NULL || (0 == strcmp(output, "-")));

    FILE *fp = stdout;
    if (!write_to_stdout) {
        blogc_mkdir_recursive(output);
        fp = fopen(output, "w");
        if (fp == NULL) {
            fprintf(stderr, "blogc: error: failed to open output file (%s): %s\n",
                output, strerror(errno));
            rv = 1;
            goto cleanup4;
        }
    }

    if (out != NULL)
        fprintf(fp, "%s", out);

    if (!write_to_stdout)
        fclose(fp);

cleanup4:
    free(out);
cleanup3:
    blogc_template_free_ast(l);
cleanup2:
    bc_slist_free_full(s, (bc_free_func_t) bc_trie_free);
    bc_error_free(err);
cleanup:
    bc_trie_free(config);
    free(template);
    free(output);
    free(print);
    bc_slist_free_full(listing_entries, free);
    bc_slist_free_full(listing_entries_source, (bc_free_func_t) bc_trie_free);
    bc_slist_free_full(sources, free);
    return rv;
}